

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O0

void test_late_ack(void)

{
  int iVar1;
  quicly_sent_packet_t *pqVar2;
  quicly_sent_packet_t *sent;
  quicly_sentmap_iter_t iter;
  quicly_sentmap_t map;
  quicly_sentmap_iter_t *in_stack_ffffffffffffffb8;
  quicly_sentmap_t *in_stack_ffffffffffffffc0;
  quicly_sentmap_t *in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffd7;
  int64_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  quicly_sentmap_event_t in_stack_ffffffffffffffe4;
  quicly_sentmap_t *in_stack_ffffffffffffffe8;
  quicly_sentmap_t *in_stack_fffffffffffffff0;
  
  on_acked_callcnt = 0;
  on_acked_ackcnt = 0;
  quicly_sentmap_init((quicly_sentmap_t *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  quicly_sentmap_prepare
            (in_stack_ffffffffffffffe8,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
  quicly_sentmap_allocate(in_stack_ffffffffffffffc8,(quicly_sent_acked_cb)in_stack_ffffffffffffffc0)
  ;
  quicly_sentmap_commit
            (in_stack_ffffffffffffffc0,(uint16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30));
  quicly_sentmap_prepare
            (in_stack_ffffffffffffffe8,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
  quicly_sentmap_allocate(in_stack_ffffffffffffffc8,(quicly_sent_acked_cb)in_stack_ffffffffffffffc0)
  ;
  quicly_sentmap_commit
            (in_stack_ffffffffffffffc0,(uint16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30));
  _ok((int)(ulong)(in_stack_fffffffffffffff0 == (quicly_sentmap_t *)0x1e),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x7a);
  quicly_sentmap_init_iter(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pqVar2 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x136bed);
  if (pqVar2->packet_number != 1) {
    __assert_fail("sent->packet_number == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x7f,"void test_late_ack(void)");
  }
  iVar1 = quicly_sentmap_update
                    (in_stack_fffffffffffffff0,(quicly_sentmap_iter_t *)in_stack_ffffffffffffffe8,
                     in_stack_ffffffffffffffe4);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x80);
  _ok((int)(ulong)(on_acked_callcnt == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x81);
  _ok((int)(ulong)(on_acked_ackcnt == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x82);
  _ok((int)(ulong)(in_stack_fffffffffffffff0 == (quicly_sentmap_t *)0x14),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x83);
  quicly_sentmap_init_iter(in_stack_ffffffffffffffc0,(quicly_sentmap_iter_t *)pqVar2);
  pqVar2 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x136ce8);
  if (pqVar2->packet_number == 1) {
    iVar1 = quicly_sentmap_update
                      (in_stack_fffffffffffffff0,(quicly_sentmap_iter_t *)in_stack_ffffffffffffffe8,
                       in_stack_ffffffffffffffe4);
    _ok((int)(ulong)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x89);
    pqVar2 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x136d57);
    if (pqVar2->packet_number == 2) {
      iVar1 = quicly_sentmap_update
                        (in_stack_fffffffffffffff0,
                         (quicly_sentmap_iter_t *)in_stack_ffffffffffffffe8,
                         in_stack_ffffffffffffffe4);
      _ok((int)(ulong)(iVar1 == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8c);
      _ok((int)(ulong)(on_acked_callcnt == 3),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8d);
      _ok((int)(ulong)(on_acked_ackcnt == 2),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8e);
      _ok((int)(ulong)(in_stack_fffffffffffffff0 == (quicly_sentmap_t *)0x0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8f);
      quicly_sentmap_dispose(in_stack_ffffffffffffffc0);
      return;
    }
    __assert_fail("sent->packet_number == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x8b,"void test_late_ack(void)");
  }
  __assert_fail("sent->packet_number == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                ,0x88,"void test_late_ack(void)");
}

Assistant:

static void test_late_ack(void)
{
    quicly_sentmap_t map;
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;

    on_acked_callcnt = 0;
    on_acked_ackcnt = 0;

    quicly_sentmap_init(&map);

    /* commit pn 1, 2 */
    quicly_sentmap_prepare(&map, 1, 0, QUICLY_EPOCH_INITIAL);
    quicly_sentmap_allocate(&map, on_acked);
    quicly_sentmap_commit(&map, 10);
    quicly_sentmap_prepare(&map, 2, 0, QUICLY_EPOCH_INITIAL);
    quicly_sentmap_allocate(&map, on_acked);
    quicly_sentmap_commit(&map, 20);
    ok(map.bytes_in_flight == 30);

    /* mark pn 1 as lost */
    quicly_sentmap_init_iter(&map, &iter);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 1);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_LOST) == 0);
    ok(on_acked_callcnt == 1);
    ok(on_acked_ackcnt == 0);
    ok(map.bytes_in_flight == 20);

    /* mark pn 1, 2 as acked */
    quicly_sentmap_init_iter(&map, &iter);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 1);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 2);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);
    ok(on_acked_callcnt == 3);
    ok(on_acked_ackcnt == 2);
    ok(map.bytes_in_flight == 0);

    quicly_sentmap_dispose(&map);
}